

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_put(adios2_engine *engine,adios2_variable *variable,void *data,adios2_mode mode)

{
  Variable *pVVar1;
  Mode MVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  uint *puVar6;
  double *pdVar7;
  char *in_RDX;
  long in_RSI;
  Variable *in_RDI;
  string dataStr;
  Mode modeCpp;
  DataType type;
  VariableBase *variableBase;
  Engine *engineCpp;
  complex *local_340;
  complex *local_320;
  longdouble *local_300;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined8 in_stack_fffffffffffffd20;
  adios2_mode mode_00;
  float *local_2c0;
  ulong *local_2a0;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  adios2_variable *in_stack_fffffffffffffd80;
  ushort *local_260;
  uchar *local_240;
  long *local_220;
  int *local_200;
  short *local_1e0;
  signed *local_1c0;
  char *local_198;
  string *local_178;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  Mode local_a0;
  DataType local_9c;
  long local_98;
  allocator local_89;
  string local_88 [32];
  Variable *local_68;
  allocator local_49;
  string local_48 [40];
  char *local_20;
  long local_18;
  Variable *local_10;
  
  mode_00 = (adios2_mode)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"for adios2_engine, in call to adios2_put",&local_49);
  adios2::helper::CheckForNullptr<adios2_engine>
            ((adios2_engine *)in_stack_fffffffffffffd80,
             (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"for adios2_variable, in call to adios2_put",&local_89);
  adios2::helper::CheckForNullptr<adios2_variable>
            (in_stack_fffffffffffffd80,
             (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = local_18;
  local_9c = *(DataType *)(local_18 + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,
             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_put",
             &local_c1);
  MVar2 = anon_unknown.dwarf_205d4::adios2_ToMode
                    (mode_00,(string *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                    );
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  DVar5 = local_9c;
  if (local_9c != Struct) {
    local_a0 = MVar2;
    DVar3 = adios2::helper::GetDataType<std::__cxx11::string>();
    DVar4 = local_9c;
    if (DVar5 == DVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,local_20,&local_e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      pVVar1 = local_68;
      if (local_98 == 0) {
        local_178 = (string *)0x0;
      }
      else {
        local_178 = (string *)
                    __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      }
      adios2::core::Engine::Put<std::__cxx11::string>(pVVar1,local_178,(Mode)local_e8);
      std::__cxx11::string::~string(local_e8);
    }
    else {
      DVar3 = adios2::helper::GetDataType<char>();
      pVVar1 = local_68;
      DVar5 = local_9c;
      if (DVar4 == DVar3) {
        if (local_98 == 0) {
          local_198 = (char *)0x0;
        }
        else {
          local_198 = (char *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<char>::typeinfo,0);
        }
        adios2::core::Engine::Put<char>(pVVar1,local_198,(Mode)local_20);
      }
      else {
        DVar3 = adios2::helper::GetDataType<signed_char>();
        pVVar1 = local_68;
        DVar4 = local_9c;
        if (DVar5 == DVar3) {
          if (local_98 == 0) {
            local_1c0 = (signed *)0x0;
          }
          else {
            local_1c0 = (signed *)
                        __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<signed_char>::typeinfo,0);
          }
          adios2::core::Engine::Put<signed_char>(pVVar1,local_1c0,(Mode)local_20);
        }
        else {
          DVar3 = adios2::helper::GetDataType<short>();
          pVVar1 = local_68;
          DVar5 = local_9c;
          if (DVar4 == DVar3) {
            if (local_98 == 0) {
              local_1e0 = (short *)0x0;
            }
            else {
              local_1e0 = (short *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                  &adios2::core::Variable<short>::typeinfo,0);
            }
            adios2::core::Engine::Put<short>(pVVar1,local_1e0,(Mode)local_20);
          }
          else {
            DVar3 = adios2::helper::GetDataType<int>();
            pVVar1 = local_68;
            DVar4 = local_9c;
            if (DVar5 == DVar3) {
              if (local_98 == 0) {
                local_200 = (int *)0x0;
              }
              else {
                local_200 = (int *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                  &adios2::core::Variable<int>::typeinfo,0);
              }
              adios2::core::Engine::Put<int>(pVVar1,local_200,(Mode)local_20);
            }
            else {
              DVar3 = adios2::helper::GetDataType<long>();
              pVVar1 = local_68;
              DVar5 = local_9c;
              if (DVar4 == DVar3) {
                if (local_98 == 0) {
                  local_220 = (long *)0x0;
                }
                else {
                  local_220 = (long *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                     &adios2::core::Variable<long>::typeinfo,0);
                }
                adios2::core::Engine::Put<long>(pVVar1,local_220,(Mode)local_20);
              }
              else {
                DVar3 = adios2::helper::GetDataType<unsigned_char>();
                pVVar1 = local_68;
                DVar4 = local_9c;
                if (DVar5 == DVar3) {
                  if (local_98 == 0) {
                    local_240 = (uchar *)0x0;
                  }
                  else {
                    local_240 = (uchar *)__dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                  typeinfo,
                                                        &adios2::core::Variable<unsigned_char>::
                                                         typeinfo,0);
                  }
                  adios2::core::Engine::Put<unsigned_char>(pVVar1,local_240,(Mode)local_20);
                }
                else {
                  DVar3 = adios2::helper::GetDataType<unsigned_short>();
                  pVVar1 = local_68;
                  DVar5 = local_9c;
                  if (DVar4 == DVar3) {
                    if (local_98 == 0) {
                      local_260 = (ushort *)0x0;
                    }
                    else {
                      local_260 = (ushort *)
                                  __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<unsigned_short>::typeinfo,0
                                                );
                    }
                    adios2::core::Engine::Put<unsigned_short>(pVVar1,local_260,(Mode)local_20);
                  }
                  else {
                    DVar4 = adios2::helper::GetDataType<unsigned_int>();
                    pVVar1 = local_68;
                    if (DVar5 == DVar4) {
                      if (local_98 == 0) {
                        puVar6 = (uint *)0x0;
                      }
                      else {
                        puVar6 = (uint *)__dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                  typeinfo,
                                                        &adios2::core::Variable<unsigned_int>::
                                                         typeinfo,0);
                      }
                      adios2::core::Engine::Put<unsigned_int>(pVVar1,puVar6,(Mode)local_20);
                    }
                    else {
                      DVar4 = local_9c;
                      DVar3 = adios2::helper::GetDataType<unsigned_long>();
                      pVVar1 = local_68;
                      DVar5 = local_9c;
                      if (DVar4 == DVar3) {
                        if (local_98 == 0) {
                          local_2a0 = (ulong *)0x0;
                        }
                        else {
                          local_2a0 = (ulong *)__dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                        typeinfo,
                                                              &adios2::core::Variable<unsigned_long>
                                                               ::typeinfo,0);
                        }
                        adios2::core::Engine::Put<unsigned_long>(pVVar1,local_2a0,(Mode)local_20);
                      }
                      else {
                        DVar3 = adios2::helper::GetDataType<float>();
                        pVVar1 = local_68;
                        DVar4 = local_9c;
                        if (DVar5 == DVar3) {
                          if (local_98 == 0) {
                            local_2c0 = (float *)0x0;
                          }
                          else {
                            local_2c0 = (float *)__dynamic_cast(local_98,&adios2::core::VariableBase
                                                                          ::typeinfo,
                                                                &adios2::core::Variable<float>::
                                                                 typeinfo,0);
                          }
                          adios2::core::Engine::Put<float>(pVVar1,local_2c0,(Mode)local_20);
                        }
                        else {
                          DVar5 = adios2::helper::GetDataType<double>();
                          pVVar1 = local_68;
                          if (DVar4 == DVar5) {
                            if (local_98 == 0) {
                              pdVar7 = (double *)0x0;
                            }
                            else {
                              pdVar7 = (double *)
                                       __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo
                                                      ,&adios2::core::Variable<double>::typeinfo,0);
                            }
                            adios2::core::Engine::Put<double>(pVVar1,pdVar7,(Mode)local_20);
                          }
                          else {
                            DVar4 = local_9c;
                            DVar3 = adios2::helper::GetDataType<long_double>();
                            pVVar1 = local_68;
                            DVar5 = local_9c;
                            if (DVar4 == DVar3) {
                              if (local_98 == 0) {
                                local_300 = (longdouble *)0x0;
                              }
                              else {
                                local_300 = (longdouble *)
                                            __dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                     typeinfo,
                                                           &adios2::core::Variable<long_double>::
                                                            typeinfo,0);
                              }
                              adios2::core::Engine::Put<long_double>
                                        (pVVar1,local_300,(Mode)local_20);
                            }
                            else {
                              DVar3 = adios2::helper::GetDataType<std::complex<float>>();
                              pVVar1 = local_68;
                              DVar4 = local_9c;
                              if (DVar5 == DVar3) {
                                if (local_98 == 0) {
                                  local_320 = (complex *)0x0;
                                }
                                else {
                                  local_320 = (complex *)
                                              __dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                       typeinfo,
                                                             &adios2::core::
                                                              Variable<std::complex<float>>::
                                                              typeinfo,0);
                                }
                                adios2::core::Engine::Put<std::complex<float>>
                                          (pVVar1,local_320,(Mode)local_20);
                              }
                              else {
                                DVar5 = adios2::helper::GetDataType<std::complex<double>>();
                                pVVar1 = local_68;
                                if (DVar4 == DVar5) {
                                  if (local_98 == 0) {
                                    local_340 = (complex *)0x0;
                                  }
                                  else {
                                    local_340 = (complex *)
                                                __dynamic_cast(local_98,&adios2::core::VariableBase
                                                                         ::typeinfo,
                                                               &adios2::core::
                                                                Variable<std::complex<double>>::
                                                                typeinfo,0);
                                  }
                                  adios2::core::Engine::Put<std::complex<double>>
                                            (pVVar1,local_340,(Mode)local_20);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_put(adios2_engine *engine, adios2_variable *variable, const void *data,
                        const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_put");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to adios2_put");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        const adios2::DataType type(variableBase->m_Type);

        const adios2::Mode modeCpp =
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "
                                "in call to adios2_put");

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const std::string dataStr(reinterpret_cast<const char *>(data));
            engineCpp->Put(*dynamic_cast<adios2::core::Variable<std::string> *>(variableBase),
                           dataStr, modeCpp);
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        engineCpp->Put(*dynamic_cast<adios2::core::Variable<T> *>(variableBase),                   \
                       reinterpret_cast<const T *>(data), modeCpp);                                \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_put"));
    }
}